

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::ConvolutionLayerParams::ConvolutionLayerParams
          (ConvolutionLayerParams *this,ConvolutionLayerParams *from)

{
  int iVar1;
  void *pvVar2;
  WeightParams *pWVar3;
  uint64 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  WeightParams *pWVar7;
  ValidPadding *this_00;
  SamePadding *this_01;
  ValidPadding *from_00;
  SamePadding *from_01;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__ConvolutionLayerParams_003d36f0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->kernelsize_).current_size_ = 0;
  (this->kernelsize_).total_size_ = 0;
  (this->kernelsize_).rep_ = (Rep *)0x0;
  iVar1 = (from->kernelsize_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(&this->kernelsize_,iVar1);
    memcpy(((this->kernelsize_).rep_)->elements,((from->kernelsize_).rep_)->elements,
           (long)(from->kernelsize_).current_size_ << 3);
    (this->kernelsize_).current_size_ = (from->kernelsize_).current_size_;
  }
  (this->stride_).current_size_ = 0;
  (this->stride_).total_size_ = 0;
  (this->stride_).rep_ = (Rep *)0x0;
  iVar1 = (from->stride_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(&this->stride_,iVar1);
    memcpy(((this->stride_).rep_)->elements,((from->stride_).rep_)->elements,
           (long)(from->stride_).current_size_ << 3);
    (this->stride_).current_size_ = (from->stride_).current_size_;
  }
  (this->dilationfactor_).current_size_ = 0;
  (this->dilationfactor_).total_size_ = 0;
  (this->dilationfactor_).rep_ = (Rep *)0x0;
  iVar1 = (from->dilationfactor_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(&this->dilationfactor_,iVar1);
    memcpy(((this->dilationfactor_).rep_)->elements,((from->dilationfactor_).rep_)->elements,
           (long)(from->dilationfactor_).current_size_ << 3);
    (this->dilationfactor_).current_size_ = (from->dilationfactor_).current_size_;
  }
  (this->outputshape_).current_size_ = 0;
  (this->outputshape_).total_size_ = 0;
  (this->outputshape_).rep_ = (Rep *)0x0;
  iVar1 = (from->outputshape_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(&this->outputshape_,iVar1);
    memcpy(((this->outputshape_).rep_)->elements,((from->outputshape_).rep_)->elements,
           (long)(from->outputshape_).current_size_ << 3);
    (this->outputshape_).current_size_ = (from->outputshape_).current_size_;
  }
  this->_cached_size_ = 0;
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  pWVar3 = from->weights_;
  if (pWVar3 == (WeightParams *)0x0 ||
      from == (ConvolutionLayerParams *)&_ConvolutionLayerParams_default_instance_) {
    pWVar7 = (WeightParams *)0x0;
  }
  else {
    pWVar7 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(pWVar7,pWVar3);
  }
  this->weights_ = pWVar7;
  pWVar3 = from->bias_;
  if (pWVar3 == (WeightParams *)0x0 ||
      from == (ConvolutionLayerParams *)&_ConvolutionLayerParams_default_instance_) {
    pWVar7 = (WeightParams *)0x0;
  }
  else {
    pWVar7 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(pWVar7,pWVar3);
  }
  this->bias_ = pWVar7;
  uVar4 = from->kernelchannels_;
  uVar5 = *(undefined8 *)((long)&from->kernelchannels_ + 2);
  uVar6 = *(undefined8 *)((long)&from->ngroups_ + 2);
  this->outputchannels_ = from->outputchannels_;
  this->kernelchannels_ = uVar4;
  *(undefined8 *)((long)&this->kernelchannels_ + 2) = uVar5;
  *(undefined8 *)((long)&this->ngroups_ + 2) = uVar6;
  this->_oneof_case_[0] = 0;
  if (from->_oneof_case_[0] == 0x33) {
    clear_ConvolutionPaddingType(this);
    this->_oneof_case_[0] = 0x33;
    this_01 = (SamePadding *)operator_new(0x18);
    SamePadding::SamePadding(this_01);
    (this->ConvolutionPaddingType_).same_ = this_01;
    if (from->_oneof_case_[0] == 0x33) {
      from_01 = (from->ConvolutionPaddingType_).same_;
    }
    else {
      protobuf_NeuralNetwork_2eproto::InitDefaults();
      from_01 = (SamePadding *)&_SamePadding_default_instance_;
    }
    SamePadding::MergeFrom(this_01,from_01);
  }
  else if (from->_oneof_case_[0] == 0x32) {
    clear_ConvolutionPaddingType(this);
    this->_oneof_case_[0] = 0x32;
    this_00 = (ValidPadding *)operator_new(0x20);
    ValidPadding::ValidPadding(this_00);
    (this->ConvolutionPaddingType_).valid_ = this_00;
    if (from->_oneof_case_[0] == 0x32) {
      from_00 = (from->ConvolutionPaddingType_).valid_;
    }
    else {
      protobuf_NeuralNetwork_2eproto::InitDefaults();
      from_00 = (ValidPadding *)&_ValidPadding_default_instance_;
    }
    ValidPadding::MergeFrom(this_00,from_00);
  }
  return;
}

Assistant:

ConvolutionLayerParams::ConvolutionLayerParams(const ConvolutionLayerParams& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      kernelsize_(from.kernelsize_),
      stride_(from.stride_),
      dilationfactor_(from.dilationfactor_),
      outputshape_(from.outputshape_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_weights()) {
    weights_ = new ::CoreML::Specification::WeightParams(*from.weights_);
  } else {
    weights_ = NULL;
  }
  if (from.has_bias()) {
    bias_ = new ::CoreML::Specification::WeightParams(*from.bias_);
  } else {
    bias_ = NULL;
  }
  ::memcpy(&outputchannels_, &from.outputchannels_,
    reinterpret_cast<char*>(&hasbias_) -
    reinterpret_cast<char*>(&outputchannels_) + sizeof(hasbias_));
  clear_has_ConvolutionPaddingType();
  switch (from.ConvolutionPaddingType_case()) {
    case kValid: {
      mutable_valid()->::CoreML::Specification::ValidPadding::MergeFrom(from.valid());
      break;
    }
    case kSame: {
      mutable_same()->::CoreML::Specification::SamePadding::MergeFrom(from.same());
      break;
    }
    case CONVOLUTIONPADDINGTYPE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.ConvolutionLayerParams)
}